

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int ON_StringLengthUTF16(ON__UINT16 *string,size_t string_capacity)

{
  ON__UINT16 *end;
  ON__UINT16 *string1;
  size_t string_capacity_local;
  ON__UINT16 *string_local;
  
  end = string;
  if ((string != (ON__UINT16 *)0x0) && (string_capacity != 0)) {
    for (; (end < string + string_capacity && (*end != 0)); end = end + 1) {
    }
  }
  return (int)((long)end - (long)string >> 1);
}

Assistant:

int ON_StringLengthUTF16(
  const ON__UINT16* string,
  size_t string_capacity
  )
{
  const ON__UINT16* string1 = string;
  if (nullptr != string1 && string_capacity > 0 )
  {
    for (const ON__UINT16* end = string1 + string_capacity; string1 < end; string1++)
    {
      if ( 0 == *string1)
        break;
    }
  }
  return (int)(string1 - string);
}